

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_cursor.cpp
# Opt level: O2

Cursor __thiscall Am_Cursor_Data::Get_X_Cursor(Am_Cursor_Data *this,Am_Drawonable_Impl *draw)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Am_Wrapper *pAVar4;
  Am_Image_Array_Data *this_00;
  Am_Image_Array_Data *this_01;
  Am_Style_Data *this_02;
  Am_Style_Data *this_03;
  Cursor CVar5;
  ostream *poVar6;
  char *pcVar7;
  undefined1 auVar8 [16];
  XColor bg_col;
  XColor fg_col;
  XColor local_50;
  XColor local_40;
  
  bVar2 = Am_Image_Array::Valid(&this->image);
  if (bVar2) {
    pAVar4 = Am_Image_Array::operator_cast_to_Am_Wrapper_(&this->image);
    this_00 = Am_Image_Array_Data::Narrow(pAVar4);
    pAVar4 = Am_Image_Array::operator_cast_to_Am_Wrapper_(&this->mask);
    this_01 = Am_Image_Array_Data::Narrow(pAVar4);
    pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&this->fg_color);
    this_02 = Am_Style_Data::Narrow(pAVar4);
    pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&this->bg_color);
    this_03 = Am_Style_Data::Narrow(pAVar4);
    auVar8._0_4_ = -(uint)((int)((ulong)this_00 >> 0x20) == 0 && (int)this_00 == 0);
    auVar8._4_4_ = -(uint)((int)this_01 == 0 && (int)((ulong)this_01 >> 0x20) == 0);
    auVar8._8_4_ = -(uint)((int)((ulong)this_02 >> 0x20) == 0 && (int)this_02 == 0);
    auVar8._12_4_ = -(uint)((int)this_03 == 0 && (int)((ulong)this_03 >> 0x20) == 0);
    iVar3 = movmskps((int)this_03,auVar8);
    if (iVar3 != 0) {
      pcVar7 = "Error in making cursor ";
      goto LAB_002751c3;
    }
    local_40 = Am_Style_Data::Get_X_Color(this_02,draw);
    local_50 = Am_Style_Data::Get_X_Color(this_03,draw);
    Am_Image_Array_Data::Get_X_Pixmap(this_00,draw);
    Am_Image_Array_Data::Get_X_Pixmap(this_01,draw);
    if (((this_00->image_ != (Am_Generic_Image *)0x0) && (1 < (this_00->image_->iminfo).depth)) ||
       ((this_01->image_ != (Am_Generic_Image *)0x0 && (1 < (this_01->image_->iminfo).depth)))) {
      Am_Error("** Tried to make a cursor out of a pixmap with depth > 1\n");
    }
    Am_Wrapper::Release(&this_02->super_Am_Wrapper);
    Am_Wrapper::Release(&this_03->super_Am_Wrapper);
    iVar1 = this_00->x_hot;
    iVar3 = this_00->y_hot;
    if (iVar3 == -1 || iVar1 == -1) {
      iVar1 = this->x_hot;
      iVar3 = this->y_hot;
    }
    if ((iVar1 == -1) || (iVar3 == -1)) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Cursor has no hot spot");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      CVar5 = XCreatePixmapCursor(draw->screen->display,this_00->main_bitmap,this_01->main_bitmap,
                                  &local_40,&local_50,iVar1,iVar3);
      if (CVar5 == 4) {
        pcVar7 = "Bad Pixmap error in making cursor ";
LAB_002751c3:
        poVar6 = std::operator<<((ostream *)&std::cerr,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar6);
        Am_Error();
      }
      if (CVar5 == 0xb) {
        pcVar7 = "Bad Alloc error in making cursor ";
        goto LAB_002751c3;
      }
      if (CVar5 == 8) {
        pcVar7 = "Bad Match error in making cursor ";
        goto LAB_002751c3;
      }
      this->main_cursor = CVar5;
    }
    Am_Wrapper::Release(&this_00->super_Am_Wrapper);
    Am_Wrapper::Release(&this_01->super_Am_Wrapper);
    CVar5 = this->main_cursor;
  }
  else {
    CVar5 = 0;
  }
  return CVar5;
}

Assistant:

Cursor
Am_Cursor_Data::Get_X_Cursor(Am_Drawonable_Impl *draw)
{
  // get the pointers to the images and the colors
  if (!image.Valid()) {
    return 0;
  }

  Am_Image_Array_Data *im = Am_Image_Array_Data::Narrow(image);
  Am_Image_Array_Data *im_mask = Am_Image_Array_Data::Narrow(mask);
  Am_Style_Data *fg_data = Am_Style_Data::Narrow(fg_color);
  Am_Style_Data *bg_data = Am_Style_Data::Narrow(bg_color);

  if (!(im && im_mask && fg_data && bg_data)) {
    std::cerr << "Error in making cursor " << std::endl;
    Am_Error();
    return 0;
  }

  // now actually get the images and the colors
  XColor fg_col = fg_data->Get_X_Color(draw);
  XColor bg_col = bg_data->Get_X_Color(draw);
  im->Get_X_Pixmap(draw);
  im_mask->Get_X_Pixmap(draw);
  if ((im->Get_Depth() > 1) || (im_mask->Get_Depth() > 1))
    Am_Error("** Tried to make a cursor out of a pixmap with depth > 1\n");

  if (fg_data)
    fg_data->Release();
  if (bg_data)
    bg_data->Release();

  // get the hot spot
  int used_x_hot, used_y_hot;
  im->Get_Hot_Spot(used_x_hot, used_y_hot);

  if ((used_x_hot == -1) || (used_y_hot == -1)) {
    used_x_hot = x_hot;
    used_y_hot = y_hot;
  }

  if ((used_x_hot == -1) || (used_y_hot == -1)) {
    std::cerr << "Cursor has no hot spot" << std::endl;
  } else {
    // make a cursor
    Cursor cursor = XCreatePixmapCursor(draw->screen->display, im->main_bitmap,
                                        im_mask->main_bitmap, &fg_col, &bg_col,
                                        used_x_hot, used_y_hot);
    if (cursor == BadMatch) {
      std::cerr << "Bad Match error in making cursor " << std::endl;
      Am_Error();
    } else if (cursor == BadAlloc) {
      std::cerr << "Bad Alloc error in making cursor " << std::endl;
      Am_Error();
    } else if (cursor == BadPixmap) {
      std::cerr << "Bad Pixmap error in making cursor " << std::endl;
      Am_Error();
    }
    main_cursor = cursor;
  }

  if (im)
    im->Release();
  if (im_mask)
    im_mask->Release();

  return main_cursor;
}